

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadModule(BinaryReader *this,ReadModuleOptions *options)

{
  bool bVar1;
  Result result;
  ReadSectionsOptions local_39;
  Enum local_38;
  Enum local_34;
  Enum local_30;
  uint32_t local_2c;
  Enum local_28;
  uint32_t version;
  ReadModuleOptions *pRStack_20;
  uint32_t magic;
  ReadModuleOptions *options_local;
  BinaryReader *this_local;
  
  version = 0;
  pRStack_20 = options;
  options_local = (ReadModuleOptions *)this;
  local_28 = (Enum)ReadU32(this,&version,"magic");
  bVar1 = Failed((Result)local_28);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if (version == 0x6d736100) {
    local_2c = 0;
    local_30 = (Enum)ReadU32(this,&local_2c,"version");
    bVar1 = Failed((Result)local_30);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else if (local_2c == 1) {
      local_34 = (*this->delegate_->_vptr_BinaryReaderDelegate[4])(this->delegate_,1);
      bVar1 = Succeeded((Result)local_34);
      if (bVar1) {
        local_39.stop_on_first_error = (bool)(pRStack_20->stop_on_first_error & 1);
        local_38 = (Enum)ReadSections(this,&local_39);
        bVar1 = Failed((Result)local_38);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else if (this->num_function_signatures_ == this->num_function_bodies_) {
          result.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[5])();
          bVar1 = Succeeded(result);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
          else {
            PrintError(this,"EndModule callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
        }
        else {
          PrintError(this,"function signature count != function body count");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"BeginModule callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
    else {
      PrintError(this,"bad wasm file version: %#x (expected %#x)",(ulong)local_2c,1);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  else {
    PrintError(this,"bad magic value");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadModule(const ReadModuleOptions& options) {
  uint32_t magic = 0;
  CHECK_RESULT(ReadU32(&magic, "magic"));
  ERROR_UNLESS(magic == WABT_BINARY_MAGIC, "bad magic value");
  uint32_t version = 0;
  CHECK_RESULT(ReadU32(&version, "version"));
  ERROR_UNLESS(version == WABT_BINARY_VERSION,
               "bad wasm file version: %#x (expected %#x)", version,
               WABT_BINARY_VERSION);

  CALLBACK(BeginModule, version);
  CHECK_RESULT(ReadSections(ReadSectionsOptions{options.stop_on_first_error}));
  // This is checked in ReadCodeSection, but it must be checked at the end too,
  // in case the code section was omitted.
  ERROR_UNLESS(num_function_signatures_ == num_function_bodies_,
               "function signature count != function body count");
  CALLBACK0(EndModule);

  return Result::Ok;
}